

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall
QRhiGles2::endPass(QRhiGles2 *this,QRhiCommandBuffer *cb,QRhiResourceUpdateBatch *resourceUpdates)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  _func_int *p_Var12;
  ulong uVar13;
  _func_int **pp_Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  _func_int **pp_Var19;
  int iVar20;
  int iVar21;
  undefined4 uVar22;
  ulong uVar23;
  _func_int *p_Var24;
  int iVar25;
  int iVar26;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (**(code **)(*cb[5].super_QRhiResource._vptr_QRhiResource + 0x10))();
  if (iVar8 == 6) {
    pp_Var19 = cb[5].super_QRhiResource._vptr_QRhiResource;
    if (pp_Var19[8] != (_func_int *)0x0) {
      p_Var24 = pp_Var19[9];
      p_Var12 = p_Var24 + (long)pp_Var19[8] * 0x30;
      do {
        lVar17 = *(long *)(p_Var24 + 0x18);
        if (lVar17 != 0) {
          uVar23 = *(ulong *)(lVar17 + 0x34);
          lVar18 = *(long *)(p_Var24 + 8);
          iVar8 = (int)uVar23;
          iVar21 = (int)(uVar23 >> 0x20);
          if (lVar18 == 0) {
            if (((this->caps).field_0x3d & 1) == 0) {
              lVar18 = *(long *)p_Var24;
              uVar13 = *(ulong *)(lVar18 + 0x34);
              if (((int)uVar13 != iVar8) || ((int)(uVar13 >> 0x20) != iVar21)) {
                local_58[0] = '\x02';
                local_58[1] = '\0';
                local_58[2] = '\0';
                local_58[3] = '\0';
                local_58[4] = '\0';
                local_58[5] = '\0';
                local_58[6] = '\0';
                local_58[7] = '\0';
                local_58[8] = '\0';
                local_58[9] = '\0';
                local_58[10] = '\0';
                local_58[0xb] = '\0';
                local_58[0xc] = '\0';
                local_58[0xd] = '\0';
                local_58[0xe] = '\0';
                local_58[0xf] = '\0';
                local_58[0x10] = '\0';
                local_58[0x11] = '\0';
                local_58[0x12] = '\0';
                local_58[0x13] = '\0';
                local_58[0x14] = '\0';
                local_58[0x15] = '\0';
                local_58[0x16] = '\0';
                local_58[0x17] = '\0';
                local_40 = "default";
                QMessageLogger::warning
                          (local_58,"Resolve source (%dx%d) and target (%dx%d) size does not match",
                           uVar13,uVar13 >> 0x20,uVar23,uVar23 >> 0x20);
              }
              iVar26 = *(int *)(p_Var24 + 0x28);
              if (*(int *)(p_Var24 + 0x28) < 2) {
                iVar26 = 1;
              }
              iVar25 = 0;
              do {
                iVar10 = *(int *)(p_Var24 + 0x10);
                iVar1 = *(int *)(p_Var24 + 0x20);
                iVar20 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
                if (iVar20 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
                  uVar23 = (long)iVar20 + 0x400;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = uVar23;
                  uVar13 = SUB168(auVar4 * ZEXT816(0x68),0);
                  *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar23;
                  if (SUB168(auVar4 * ZEXT816(0x68),8) != 0) {
                    uVar13 = 0xffffffffffffffff;
                  }
                  pp_Var14 = (_func_int **)operator_new__(uVar13);
                  pp_Var2 = cb[1].super_QRhiResource._vptr_QRhiResource;
                  if (pp_Var2 != (_func_int **)0x0) {
                    memcpy(pp_Var14,pp_Var2,(long)iVar20 * 0x68);
                    operator_delete__(pp_Var2);
                    iVar20 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
                  }
                  cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var14;
                }
                else {
                  pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
                }
                *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar20 + 1;
                lVar15 = (long)iVar20;
                lVar16 = lVar15 * 0x68;
                *(undefined4 *)(pp_Var14 + lVar15 * 0xd) = 0x17;
                if ((*(byte *)(lVar18 + 0x48) & 4) == 0) {
                  iVar20 = *(int *)(lVar18 + 0x6c);
                }
                else {
                  iVar20 = iVar25 + iVar10 + 0x8515;
                }
                *(int *)(pp_Var14 + lVar15 * 0xd + 1) = iVar20;
                *(undefined4 *)((long)pp_Var14 + lVar16 + 0xc) = *(undefined4 *)(lVar18 + 100);
                *(undefined4 *)(pp_Var14 + lVar15 * 0xd + 2) = *(undefined4 *)(p_Var24 + 0x14);
                *(undefined4 *)((long)pp_Var14 + lVar16 + 0x14) = 0;
                uVar9 = *(uint *)(lVar18 + 0x48) & 0x1400;
                if (uVar9 != 0) {
                  uVar9 = iVar10 + iVar25;
                }
                *(uint *)((long)pp_Var14 + lVar16 + 0x14) = uVar9;
                *(int *)(pp_Var14 + lVar15 * 0xd + 3) = iVar8;
                *(int *)((long)pp_Var14 + lVar16 + 0x1c) = iVar21;
                if ((*(byte *)(lVar17 + 0x48) & 4) == 0) {
                  iVar10 = *(int *)(lVar17 + 0x6c);
                }
                else {
                  iVar10 = iVar25 + iVar1 + 0x8515;
                }
                *(int *)(pp_Var14 + lVar15 * 0xd + 4) = iVar10;
                *(undefined4 *)((long)pp_Var14 + lVar16 + 0x24) = *(undefined4 *)(lVar17 + 100);
                *(undefined4 *)(pp_Var14 + lVar15 * 0xd + 5) = *(undefined4 *)(p_Var24 + 0x24);
                *(undefined4 *)((long)pp_Var14 + lVar16 + 0x2c) = 0;
                uVar9 = *(uint *)(lVar17 + 0x48) & 0x1400;
                if (uVar9 != 0) {
                  uVar9 = iVar1 + iVar25;
                }
                *(uint *)((long)pp_Var14 + lVar16 + 0x2c) = uVar9;
                *(undefined1 *)(pp_Var14 + lVar15 * 0xd + 6) = 0;
                iVar25 = iVar25 + 1;
              } while (iVar26 != iVar25);
            }
          }
          else {
            uVar13 = *(ulong *)(lVar18 + 0x34);
            if (((int)uVar13 != iVar8) || ((int)(uVar13 >> 0x20) != iVar21)) {
              local_58[0] = '\x02';
              local_58[1] = '\0';
              local_58[2] = '\0';
              local_58[3] = '\0';
              local_58[4] = '\0';
              local_58[5] = '\0';
              local_58[6] = '\0';
              local_58[7] = '\0';
              local_58[8] = '\0';
              local_58[9] = '\0';
              local_58[10] = '\0';
              local_58[0xb] = '\0';
              local_58[0xc] = '\0';
              local_58[0xd] = '\0';
              local_58[0xe] = '\0';
              local_58[0xf] = '\0';
              local_58[0x10] = '\0';
              local_58[0x11] = '\0';
              local_58[0x12] = '\0';
              local_58[0x13] = '\0';
              local_58[0x14] = '\0';
              local_58[0x15] = '\0';
              local_58[0x16] = '\0';
              local_58[0x17] = '\0';
              local_40 = "default";
              QMessageLogger::warning
                        (local_58,"Resolve source (%dx%d) and target (%dx%d) size does not match",
                         uVar13,uVar13 >> 0x20,uVar23,uVar23 >> 0x20);
            }
            if (((this->caps).field_0x3d & 1) == 0) {
              iVar26 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
              if (iVar26 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
                uVar23 = (long)iVar26 + 0x400;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar23;
                uVar13 = SUB168(auVar3 * ZEXT816(0x68),0);
                *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar23;
                if (SUB168(auVar3 * ZEXT816(0x68),8) != 0) {
                  uVar13 = 0xffffffffffffffff;
                }
                pp_Var14 = (_func_int **)operator_new__(uVar13);
                pp_Var2 = cb[1].super_QRhiResource._vptr_QRhiResource;
                if (pp_Var2 != (_func_int **)0x0) {
                  memcpy(pp_Var14,pp_Var2,(long)iVar26 * 0x68);
                  operator_delete__(pp_Var2);
                  iVar26 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
                }
                cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var14;
              }
              else {
                pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
              }
              *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar26 + 1;
              lVar15 = (long)iVar26;
              lVar16 = lVar15 * 0x68;
              *(undefined4 *)(pp_Var14 + lVar15 * 0xd) = 0x16;
              *(undefined4 *)(pp_Var14 + lVar15 * 0xd + 1) = *(undefined4 *)(lVar18 + 0x48);
              *(int *)((long)pp_Var14 + lVar16 + 0xc) = iVar8;
              *(int *)(pp_Var14 + lVar15 * 0xd + 2) = iVar21;
              if ((*(byte *)(lVar17 + 0x48) & 4) == 0) {
                iVar8 = *(int *)(lVar17 + 0x6c);
              }
              else {
                iVar8 = *(int *)(p_Var24 + 0x20) + 0x8515;
              }
              *(int *)((long)pp_Var14 + lVar16 + 0x14) = iVar8;
              *(undefined4 *)(pp_Var14 + lVar15 * 0xd + 3) = *(undefined4 *)(lVar17 + 100);
              *(undefined4 *)((long)pp_Var14 + lVar16 + 0x1c) = *(undefined4 *)(p_Var24 + 0x24);
              if ((*(byte *)(lVar17 + 0x49) & 0x14) == 0) {
                uVar11 = 0;
              }
              else {
                uVar11 = *(undefined4 *)(p_Var24 + 0x20);
              }
              *(undefined4 *)(pp_Var14 + lVar15 * 0xd + 4) = uVar11;
              *(undefined1 *)((long)pp_Var14 + lVar16 + 0x24) = 0;
            }
          }
        }
        p_Var24 = p_Var24 + 0x30;
      } while (p_Var24 != p_Var12);
    }
    p_Var24 = pp_Var19[0x3c];
    if (p_Var24 != (_func_int *)0x0) {
      p_Var12 = pp_Var19[0x3a];
      uVar11 = (undefined4)*(undefined8 *)(p_Var24 + 0x34);
      uVar22 = (undefined4)((ulong)*(undefined8 *)(p_Var24 + 0x34) >> 0x20);
      if (p_Var12 == (_func_int *)0x0) {
        if (((this->caps).field_0x3d & 1) == 0) {
          p_Var12 = pp_Var19[0x3b];
          iVar8 = 1;
          if (1 < *(int *)(p_Var12 + 0x40)) {
            iVar8 = *(int *)(p_Var12 + 0x40);
          }
          iVar21 = 0;
          do {
            iVar26 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
            if (iVar26 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
              uVar23 = (long)iVar26 + 0x400;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar23;
              uVar13 = SUB168(auVar6 * ZEXT816(0x68),0);
              *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar23;
              if (SUB168(auVar6 * ZEXT816(0x68),8) != 0) {
                uVar13 = 0xffffffffffffffff;
              }
              pp_Var14 = (_func_int **)operator_new__(uVar13);
              pp_Var2 = cb[1].super_QRhiResource._vptr_QRhiResource;
              if (pp_Var2 != (_func_int **)0x0) {
                memcpy(pp_Var14,pp_Var2,(long)iVar26 * 0x68);
                operator_delete__(pp_Var2);
                iVar26 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
              }
              cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var14;
            }
            else {
              pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
            }
            *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar26 + 1;
            lVar17 = (long)iVar26;
            lVar18 = lVar17 * 0x68;
            *(undefined4 *)(pp_Var14 + lVar17 * 0xd) = 0x17;
            *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 1) = *(undefined4 *)(p_Var12 + 0x6c);
            *(undefined4 *)((long)pp_Var14 + lVar18 + 0xc) = *(undefined4 *)(p_Var12 + 100);
            *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 2) = 0;
            *(int *)((long)pp_Var14 + lVar18 + 0x14) = iVar21;
            *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 3) = uVar11;
            *(undefined4 *)((long)pp_Var14 + lVar18 + 0x1c) = uVar22;
            *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 4) = *(undefined4 *)(p_Var24 + 0x6c);
            *(undefined4 *)((long)pp_Var14 + lVar18 + 0x24) = *(undefined4 *)(p_Var24 + 100);
            *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 5) = 0;
            *(int *)((long)pp_Var14 + lVar18 + 0x2c) = iVar21;
            *(undefined1 *)(pp_Var14 + lVar17 * 0xd + 6) = 1;
            iVar21 = iVar21 + 1;
          } while (iVar8 != iVar21);
        }
      }
      else {
        iVar8 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
        if (iVar8 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
          uVar23 = (long)iVar8 + 0x400;
          *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar23;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar23;
          uVar23 = 0xffffffffffffffff;
          if (SUB168(auVar5 * ZEXT816(0x68),8) == 0) {
            uVar23 = SUB168(auVar5 * ZEXT816(0x68),0);
          }
          pp_Var14 = (_func_int **)operator_new__(uVar23);
          pp_Var2 = cb[1].super_QRhiResource._vptr_QRhiResource;
          if (pp_Var2 != (_func_int **)0x0) {
            memcpy(pp_Var14,pp_Var2,(long)iVar8 * 0x68);
            operator_delete__(pp_Var2);
            iVar8 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
          }
          cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var14;
        }
        else {
          pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
        }
        *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar8 + 1;
        lVar17 = (long)iVar8;
        lVar18 = lVar17 * 0x68;
        *(undefined4 *)(pp_Var14 + lVar17 * 0xd) = 0x16;
        *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 1) = *(undefined4 *)(p_Var12 + 0x48);
        *(undefined4 *)((long)pp_Var14 + lVar18 + 0xc) = uVar11;
        *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 2) = uVar22;
        *(undefined4 *)((long)pp_Var14 + lVar18 + 0x14) = *(undefined4 *)(p_Var24 + 0x6c);
        *(undefined4 *)(pp_Var14 + lVar17 * 0xd + 3) = *(undefined4 *)(p_Var24 + 100);
        *(undefined8 *)((long)pp_Var14 + lVar18 + 0x1c) = 0;
        *(undefined1 *)((long)pp_Var14 + lVar18 + 0x24) = 1;
      }
    }
    if (((pp_Var19[0x3a] != (_func_int *)0x0) ||
        ((pp_Var19[0x3b] != (_func_int *)0x0 && (((ulong)pp_Var19[0x3e] & 4) != 0)))) &&
       (pp_Var19[0x3c] == (_func_int *)0x0)) {
      iVar8 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
      if (iVar8 == *(int *)&cb[1].super_QRhiResource.m_rhi) {
        uVar23 = (long)iVar8 + 0x400;
        *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar23;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar23;
        uVar23 = 0xffffffffffffffff;
        if (SUB168(auVar7 * ZEXT816(0x68),8) == 0) {
          uVar23 = SUB168(auVar7 * ZEXT816(0x68),0);
        }
        pp_Var19 = (_func_int **)operator_new__(uVar23);
        pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
        if (pp_Var14 != (_func_int **)0x0) {
          memcpy(pp_Var19,pp_Var14,(long)iVar8 * 0x68);
          operator_delete__(pp_Var14);
          iVar8 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
        }
        cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var19;
      }
      else {
        pp_Var19 = cb[1].super_QRhiResource._vptr_QRhiResource;
      }
      *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar8 + 1;
      lVar17 = (long)iVar8;
      *(undefined4 *)(pp_Var19 + lVar17 * 0xd) = 0x1d;
      if (((this->caps).field_0x39 & 0x40) == 0) {
        pp_Var19[lVar17 * 0xd + 1] = (_func_int *)0x8d0000000002;
        *(undefined4 *)(pp_Var19 + lVar17 * 0xd + 2) = 0x8d20;
      }
      else {
        pp_Var19[lVar17 * 0xd + 1] = (_func_int *)0x821a00000001;
      }
    }
  }
  *(undefined4 *)((long)&cb[4].super_QRhiResource.m_objectName.d.d + 4) = 0;
  cb[5].super_QRhiResource._vptr_QRhiResource = (_func_int **)0x0;
  if (resourceUpdates != (QRhiResourceUpdateBatch *)0x0) {
    enqueueResourceUpdates(this,cb,resourceUpdates);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::endPass(QRhiCommandBuffer *cb, QRhiResourceUpdateBatch *resourceUpdates)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::RenderPass);

    if (cbD->currentTarget->resourceType() == QRhiResource::TextureRenderTarget) {
        QGles2TextureRenderTarget *rtTex = QRHI_RES(QGles2TextureRenderTarget, cbD->currentTarget);
        for (auto it = rtTex->m_desc.cbeginColorAttachments(), itEnd = rtTex->m_desc.cendColorAttachments();
             it != itEnd; ++it)
        {
            const QRhiColorAttachment &colorAtt(*it);
            if (!colorAtt.resolveTexture())
                continue;

            QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
            const QSize size = resolveTexD->pixelSize();
            if (colorAtt.renderBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, colorAtt.renderBuffer());
                if (rbD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             rbD->pixelSize().width(), rbD->pixelSize().height(), size.width(), size.height());
                }
                if (caps.glesMultisampleRenderToTexture) {
                    // colorAtt.renderBuffer() is not actually used for anything if OpenGL ES'
                    // auto-resolving GL_EXT_multisampled_render_to_texture is used.
                } else {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                    cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                    cmd.args.blitFromRenderbuffer.w = size.width();
                    cmd.args.blitFromRenderbuffer.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromRenderbuffer.target = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(colorAtt.resolveLayer());
                    else
                        cmd.args.blitFromRenderbuffer.target = resolveTexD->target;
                    cmd.args.blitFromRenderbuffer.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromRenderbuffer.dstLevel = colorAtt.resolveLevel();
                    const bool hasZ = resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional)
                        || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray);
                    cmd.args.blitFromRenderbuffer.dstLayer = hasZ ? colorAtt.resolveLayer() : 0;
                    cmd.args.blitFromRenderbuffer.isDepthStencil = false;
                }
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into colorAtt.resolveTexture() is automatic,
                // colorAtt.texture() is in fact not used for anything.
            } else {
                Q_ASSERT(colorAtt.texture());
                QGles2Texture *texD = QRHI_RES(QGles2Texture, colorAtt.texture());
                if (texD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             texD->pixelSize().width(), texD->pixelSize().height(), size.width(), size.height());
                }
                const int resolveCount = colorAtt.multiViewCount() >= 2 ? colorAtt.multiViewCount() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    const int srcLayer = colorAtt.layer() + resolveIdx;
                    const int dstLayer = colorAtt.resolveLayer() + resolveIdx;
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    if (texD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.srcTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(srcLayer);
                    else
                        cmd.args.blitFromTexture.srcTarget = texD->target;
                    cmd.args.blitFromTexture.srcTexture = texD->texture;
                    cmd.args.blitFromTexture.srcLevel = colorAtt.level();
                    cmd.args.blitFromTexture.srcLayer = 0;
                    if (texD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || texD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.srcLayer = srcLayer;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.dstTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(dstLayer);
                    else
                        cmd.args.blitFromTexture.dstTarget = resolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = colorAtt.resolveLevel();
                    cmd.args.blitFromTexture.dstLayer = 0;
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.dstLayer = dstLayer;
                    cmd.args.blitFromTexture.isDepthStencil = false;
                }
            }
        }

        if (rtTex->m_desc.depthResolveTexture()) {
            QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthResolveTexture());
            const QSize size = depthResolveTexD->pixelSize();
            if (rtTex->m_desc.depthStencilBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, rtTex->m_desc.depthStencilBuffer());
                QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                cmd.args.blitFromRenderbuffer.w = size.width();
                cmd.args.blitFromRenderbuffer.h = size.height();
                cmd.args.blitFromRenderbuffer.target = depthResolveTexD->target;
                cmd.args.blitFromRenderbuffer.dstTexture = depthResolveTexD->texture;
                cmd.args.blitFromRenderbuffer.dstLevel = 0;
                cmd.args.blitFromRenderbuffer.dstLayer = 0;
                cmd.args.blitFromRenderbuffer.isDepthStencil = true;
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into depthResolveTexture() is automatic.
            } else {
                QGles2Texture *depthTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthTexture());
                const int resolveCount = depthTexD->arraySize() >= 2 ? depthTexD->arraySize() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    cmd.args.blitFromTexture.srcTarget = depthTexD->target;
                    cmd.args.blitFromTexture.srcTexture = depthTexD->texture;
                    cmd.args.blitFromTexture.srcLevel = 0;
                    cmd.args.blitFromTexture.srcLayer = resolveIdx;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    cmd.args.blitFromTexture.dstTarget = depthResolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = depthResolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = 0;
                    cmd.args.blitFromTexture.dstLayer = resolveIdx;
                    cmd.args.blitFromTexture.isDepthStencil = true;
                }
            }
        }

        const bool mayDiscardDepthStencil =
            (rtTex->m_desc.depthStencilBuffer()
             || (rtTex->m_desc.depthTexture() && rtTex->m_flags.testFlag(QRhiTextureRenderTarget::DoNotStoreDepthStencilContents)))
            && !rtTex->m_desc.depthResolveTexture();
        if (mayDiscardDepthStencil) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::InvalidateFramebuffer;
            if (caps.needsDepthStencilCombinedAttach) {
                cmd.args.invalidateFramebuffer.attCount = 1;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_STENCIL_ATTACHMENT;
            } else {
                cmd.args.invalidateFramebuffer.attCount = 2;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_ATTACHMENT;
                cmd.args.invalidateFramebuffer.att[1] = GL_STENCIL_ATTACHMENT;
            }
        }
    }

    cbD->recordingPass = QGles2CommandBuffer::NoPass;
    cbD->currentTarget = nullptr;

    if (resourceUpdates)
        enqueueResourceUpdates(cb, resourceUpdates);
}